

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveglsl_tests.cpp
# Opt level: O2

void utest_register_filewatcher_add_watch_modify_1(void)

{
  size_t sVar1;
  char *pcVar2;
  utest_test_state_s *puVar3;
  
  sVar1 = utest_state.tests_length;
  utest_state.tests_length = utest_state.tests_length + 1;
  pcVar2 = (char *)malloc(0x1f);
  puVar3 = (utest_test_state_s *)realloc(utest_state.tests,sVar1 * 0x18 + 0x18);
  utest_state.tests = puVar3;
  puVar3[sVar1].func = utest_filewatcher_add_watch_modify_1;
  puVar3[sVar1].name = pcVar2;
  builtin_strncpy(pcVar2,"filewatcher.add_watch_modify_1",0x1f);
  return;
}

Assistant:

UTEST(filewatcher, add_watch_modify_1) {
    const char* file_path = "test_file.txt";
    std::ofstream file(file_path);
    file << "File dummy content";
    file.close();

    bool callback_called = false;
    HFileWatcher watcher = FileWatcherCreate(OnFileChanged, &callback_called, 16);
    FileWatcherAddWatch(watcher, file_path);

    std::this_thread::sleep_for(std::chrono::milliseconds(100));

    T(!callback_called);

    FileWatcherRemoveWatch(watcher, file_path);
    FileWatcherDestroy(watcher);

    std::remove(file_path);
}